

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

bool write_to_descriptor(int desc,char *txt,int length)

{
  size_t sVar1;
  int *piVar2;
  ssize_t sVar3;
  int in_EDX;
  char **in_RSI;
  int in_EDI;
  string_view in_stack_00000000;
  int nBlock;
  int nWrite;
  int iStart;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined4 in_stack_fffffffffffffffc;
  
  local_14 = in_EDX;
  if (in_EDX < 1) {
    sVar1 = strlen((char *)in_RSI);
    local_14 = (int)sVar1;
  }
  local_18 = 0;
  while( true ) {
    if (local_14 <= local_18) {
      return true;
    }
    local_24 = local_14 - local_18;
    local_28 = 0x1000;
    piVar2 = std::min<int>(&local_24,&local_28);
    local_20 = *piVar2;
    sVar3 = write(in_EDI,(char *)((long)in_RSI + (long)local_18),(long)local_20);
    local_1c = (int)sVar3;
    if (local_1c < 0) break;
    local_18 = local_1c + local_18;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  piVar2 = __errno_location();
  strerror(*piVar2);
  CLogger::Warn<char*>
            ((CLogger *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),in_stack_00000000,in_RSI);
  return false;
}

Assistant:

bool write_to_descriptor(int desc, char *txt, int length)
{
	int iStart;
	int nWrite;
	int nBlock;

	if (length <= 0)
		length = strlen(txt);

	for (iStart = 0; iStart < length; iStart += nWrite)
	{
		nBlock = std::min(length - iStart, 4096);
		if ((nWrite = write(desc, txt + iStart, nBlock)) < 0)
		{
			RS.Logger.Warn("Write_to_descriptor: write: {}", std::strerror(errno));
			return false;
		}
	}

	return true;
}